

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::Logger::log_<char[12],char*>
          (Logger *this,Level level,int vlevel,char *s,char (*value) [12],char **args)

{
  char *in_RCX;
  MessageBuilder *in_RDI;
  Logger *in_R8;
  undefined8 in_R9;
  MessageBuilder b;
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  Logger *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  char *local_18;
  
  el::base::MessageBuilder::MessageBuilder((MessageBuilder *)&stack0xffffffffffffffc8);
  el::base::MessageBuilder::initialize
            (in_RDI,(Logger *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  local_18 = in_RCX;
  do {
    if (*local_18 == '\0') {
      return;
    }
    if (*local_18 == '%') {
      if (local_18[1] == '%') {
        local_18 = local_18 + 1;
      }
      else if (local_18[1] == 'v') {
        el::base::MessageBuilder::operator<<
                  (in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
        log_<char*>(in_R8,(Level)((ulong)in_R9 >> 0x20),(int)in_R9,in_stack_ffffffffffffffd0,
                    (char **)in_stack_ffffffffffffffc8);
        return;
      }
    }
    local_18 = local_18 + 1;
    el::base::MessageBuilder::operator<<(in_RDI,in_stack_ffffffffffffffbf);
  } while( true );
}

Assistant:

void Logger::log_(Level level, int vlevel, const char* s, const T& value, const Args&... args) {
  base::MessageBuilder b;
  b.initialize(this);
  while (*s) {
    if (*s == base::consts::kFormatSpecifierChar) {
      if (*(s + 1) == base::consts::kFormatSpecifierChar) {
        ++s;
      } else {
        if (*(s + 1) == base::consts::kFormatSpecifierCharValue) {
          ++s;
          b << value;
          log_(level, vlevel, ++s, args...);
          return;
        }
      }
    }
    b << *s++;
  }
  ELPP_INTERNAL_ERROR("Too many arguments provided. Unable to handle. Please provide more format specifiers", false);
}